

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# obj-ignore.c
# Opt level: O2

wchar_t remove_autoinscription(int16_t kind)

{
  object_kind *poVar1;
  quark_t *pqVar2;
  wchar_t wVar3;
  undefined2 in_register_0000003a;
  
  poVar1 = objkind_byid(CONCAT22(in_register_0000003a,kind));
  wVar3 = L'\0';
  if (poVar1 != (object_kind *)0x0) {
    if (poVar1->aware == false) {
      if (poVar1->note_unaware == 0) {
        return L'\0';
      }
      pqVar2 = &poVar1->note_unaware;
    }
    else {
      if (poVar1->note_aware == 0) {
        return L'\0';
      }
      pqVar2 = &poVar1->note_aware;
    }
    *pqVar2 = 0;
    wVar3 = L'\x01';
  }
  return wVar3;
}

Assistant:

int remove_autoinscription(int16_t kind)
{
	struct object_kind *k = objkind_byid(kind);
	if (!k)
		return 0;

	/* Unaware */
	if (!k->aware) {
		if (!k->note_unaware) {
			return 0;
		} else {
			k->note_unaware = 0;
			return 1;
		}
	}

	/* Aware */
	if (!k->note_aware)
		return 0;

	k->note_aware = 0;
	return 1;
}